

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

_Bool netaddr_isequal_binary(netaddr *addr,void *bin,size_t len,uint16_t af,uint8_t prefix_len)

{
  byte bVar1;
  int iVar2;
  
  if (addr->_type != af) {
    return false;
  }
  if ((addr->_prefix_len == prefix_len) &&
     (bVar1 = netaddr_get_af_maxprefix((uint)(ushort)addr->_type), bVar1 >> 3 == len)) {
    iVar2 = bcmp(addr,bin,len);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool
netaddr_isequal_binary(const struct netaddr *addr, const void *bin, size_t len, uint16_t af, uint8_t prefix_len) {
  uint32_t addr_len;

  if (addr->_type != af || addr->_prefix_len != prefix_len) {
    return false;
  }

  addr_len = netaddr_get_maxprefix(addr) >> 3;
  if (addr_len != len) {
    return false;
  }

  return memcmp(addr->_addr, bin, addr_len) == 0;
}